

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O0

void __thiscall fasttext::Autotune::printArgs(Autotune *this,Args *args,Args *autotuneArgs)

{
  ostream *poVar1;
  void *pvVar2;
  Args *in_RDX;
  long in_RSI;
  string local_38 [28];
  loss_name in_stack_ffffffffffffffe4;
  
  if (2 < in_RDX->verbose) {
    poVar1 = std::operator<<((ostream *)&std::cout,"epoch = ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,*(int *)(in_RSI + 0x8c));
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  }
  if (2 < in_RDX->verbose) {
    poVar1 = std::operator<<((ostream *)&std::cout,"lr = ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,*(double *)(in_RSI + 0x78));
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  }
  if (2 < in_RDX->verbose) {
    poVar1 = std::operator<<((ostream *)&std::cout,"dim = ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,*(int *)(in_RSI + 0x84));
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  }
  if (2 < in_RDX->verbose) {
    poVar1 = std::operator<<((ostream *)&std::cout,"minCount = ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,*(int *)(in_RSI + 0x90));
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  }
  if (2 < in_RDX->verbose) {
    poVar1 = std::operator<<((ostream *)&std::cout,"wordNgrams = ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,*(int *)(in_RSI + 0x9c));
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  }
  if (2 < in_RDX->verbose) {
    poVar1 = std::operator<<((ostream *)&std::cout,"minn = ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,*(int *)(in_RSI + 0xac));
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  }
  if (2 < in_RDX->verbose) {
    poVar1 = std::operator<<((ostream *)&std::cout,"maxn = ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,*(int *)(in_RSI + 0xb0));
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  }
  if (2 < in_RDX->verbose) {
    poVar1 = std::operator<<((ostream *)&std::cout,"bucket = ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,*(int *)(in_RSI + 0xa8));
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  }
  if (2 < in_RDX->verbose) {
    poVar1 = std::operator<<((ostream *)&std::cout,"dsub = ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,*(ulong *)(in_RSI + 0x120));
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  }
  if (2 < in_RDX->verbose) {
    poVar1 = std::operator<<((ostream *)&std::cout,"loss = ");
    Args::lossToString_abi_cxx11_(in_RDX,in_stack_ffffffffffffffe4);
    poVar1 = std::operator<<(poVar1,local_38);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void Autotune::printArgs(const Args& args, const Args& autotuneArgs) {
  LOG_VAL(epoch, args.epoch)
  LOG_VAL(lr, args.lr)
  LOG_VAL(dim, args.dim)
  LOG_VAL(minCount, args.minCount)
  LOG_VAL(wordNgrams, args.wordNgrams)
  LOG_VAL(minn, args.minn)
  LOG_VAL(maxn, args.maxn)
  LOG_VAL(bucket, args.bucket)
  LOG_VAL(dsub, args.dsub)
  LOG_VAL(loss, args.lossToString(args.loss))
}